

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_11,_10>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Vector<float,_4> *pVVar1;
  float *pfVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  undefined1 *puVar6;
  long lVar7;
  int col;
  long lVar8;
  int col_1;
  undefined1 auVar9 [16];
  bool bVar11;
  undefined4 uVar12;
  Type in1;
  float afStack_b0 [2];
  undefined8 local_a8;
  float local_a0;
  undefined1 local_98 [24];
  undefined8 uStack_80;
  Matrix<float,_4,_3> local_78;
  int aiStack_40 [6];
  float local_28;
  undefined8 uStack_24;
  float fStack_1c;
  float local_18;
  float local_14;
  long lVar10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    puVar6 = local_98;
    bVar11 = true;
    do {
      bVar3 = bVar11;
      lVar8 = 0;
      do {
        uVar12 = 0x3f800000;
        if (lVar5 != lVar8) {
          uVar12 = 0;
        }
        *(undefined4 *)(puVar6 + lVar8 * 8) = uVar12;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar5 = 1;
      puVar6 = local_98 + 4;
      bVar11 = false;
    } while (bVar3);
    local_98._8_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_98._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_80 = *(undefined8 *)evalCtx->in[3].m_data;
    local_98._16_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    stack0xffffffffffffff78 = (undefined1  [16])0x0;
    local_98._0_16_ = (undefined1  [16])0x0;
    lVar5 = 0;
    puVar6 = local_98;
    bVar11 = true;
    do {
      bVar3 = bVar11;
      lVar8 = 0;
      do {
        *(undefined4 *)(puVar6 + lVar8 * 8) =
             *(undefined4 *)((long)&sr::(anonymous_namespace)::s_constInMat4x2 + lVar5 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar5 = 0x10;
      puVar6 = local_98 + 4;
      bVar11 = false;
    } while (bVar3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pVVar1 = local_78.m_data.m_data + 1;
    lVar5 = 0;
    lVar8 = 0;
    do {
      lVar7 = 0;
      auVar9 = _DAT_00a99400;
      do {
        bVar11 = SUB164(auVar9 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar9 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar5 != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)
           ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar1 + -1))->m_data[0].m_data + lVar7) =
               uVar12;
        }
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar5 + -0x10 != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)pVVar1->m_data + lVar7) = uVar12;
        }
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar10 + 2;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0x40);
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 0x10;
      pVVar1 = (Vector<float,_4> *)(pVVar1->m_data + 1);
    } while (lVar8 != 4);
    local_78.m_data.m_data[0].m_data = *&evalCtx->in[0].m_data;
    local_78.m_data.m_data[1].m_data = *&evalCtx->in[1].m_data;
    local_78.m_data.m_data[2].m_data = *&evalCtx->in[2].m_data;
  }
  else {
    pfVar2 = (float *)&local_78;
    local_78.m_data.m_data[2].m_data[0] = 0.0;
    local_78.m_data.m_data[2].m_data[1] = 0.0;
    local_78.m_data.m_data[2].m_data[2] = 0.0;
    local_78.m_data.m_data[2].m_data[3] = 0.0;
    local_78.m_data.m_data[1].m_data[0] = 0.0;
    local_78.m_data.m_data[1].m_data[1] = 0.0;
    local_78.m_data.m_data[1].m_data[2] = 0.0;
    local_78.m_data.m_data[1].m_data[3] = 0.0;
    local_78.m_data.m_data[0].m_data[0] = 0.0;
    local_78.m_data.m_data[0].m_data[1] = 0.0;
    local_78.m_data.m_data[0].m_data[2] = 0.0;
    local_78.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &DAT_00af0af0;
    lVar5 = 0;
    do {
      lVar8 = 0;
      do {
        pfVar2[lVar8] = (float)*(undefined4 *)((long)puVar4 + lVar8);
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0xc);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
    } while (lVar5 != 4);
  }
  afStack_b0[0] = 8.20878e-39;
  afStack_b0[1] = 0.0;
  tcu::operator*((Matrix<float,_2,_4> *)local_98,&local_78);
  local_a8 = CONCAT44(fStack_1c + (float)((ulong)uStack_24 >> 0x20),local_28 + (float)uStack_24);
  local_a0 = local_18 + local_14;
  aiStack_40[2] = 0;
  aiStack_40[3] = 1;
  aiStack_40[4] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_40[lVar5]] = afStack_b0[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}